

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall Clasp::Solver::undoUntilImpl(Solver *this,uint32 level,bool forceSave)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint *puVar5;
  DecisionHeuristic *pDVar6;
  reference pDVar7;
  Solver *in_RDI;
  bool ok;
  bool sp;
  uint32 *n;
  uint32 *puVar8;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_14 [4];
  uint32 local_4;
  
  uVar3 = backtrackLevel(in_RDI);
  puVar5 = std::max<unsigned_int>(local_14,(uint *)&stack0xffffffffffffffe4);
  uVar1 = *puVar5;
  local_14[0] = uVar1;
  uVar4 = decisionLevel((Solver *)0x1eba1f);
  if (uVar1 < uVar4) {
    uVar4 = decisionLevel((Solver *)0x1eba46);
    puVar8 = &(in_RDI->levels_).jump;
    (in_RDI->levels_).jump = uVar4 - local_14[0];
    bVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                      (&in_RDI->conflict_);
    if (bVar2) {
      bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::back
                (&(in_RDI->levels_).super_type);
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(&in_RDI->conflict_);
    pDVar6 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1ebb32);
    pDVar7 = bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::
             operator[](&(in_RDI->levels_).super_type,local_14[0]);
    (*pDVar6->_vptr_DecisionHeuristic[8])(pDVar6,in_RDI,(ulong)(*(uint *)pDVar7 & 0x3fffffff));
    undoLevel((Solver *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),SUB81((ulong)puVar8 >> 0x38,0));
    while (uVar4 = *puVar8, *puVar8 = uVar4 - 1, uVar4 - 1 != 0) {
      undoLevel((Solver *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),SUB81((ulong)puVar8 >> 0x38,0));
    }
    local_4 = local_14[0];
  }
  else {
    local_4 = decisionLevel((Solver *)0x1eba33);
  }
  return local_4;
}

Assistant:

uint32 Solver::undoUntilImpl(uint32 level, bool forceSave) {
	level      = std::max( level, backtrackLevel() );
	if (level >= decisionLevel()) { return decisionLevel(); }
	uint32& n  = (levels_.jump = decisionLevel() - level);
	bool sp    = forceSave || (strategy_.saveProgress > 0 && ((uint32)strategy_.saveProgress) <= n);
	bool ok    = conflict_.empty() && levels_.back().freeze == 0;
	conflict_.clear();
	heuristic_->undoUntil( *this, levels_[level].trailPos);
	undoLevel(sp && ok);
	while (--n) { undoLevel(sp); }
	return level;
}